

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4plus.hpp
# Opt level: O1

string * trng::lagfib4plus<unsigned_long,168u,205u,242u,521u>::init_name_abi_cxx11_(void)

{
  ostream *poVar1;
  string *in_RDI;
  stringstream name_str;
  char local_199;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"lagfib4plus_",0xc);
  poVar1 = (ostream *)std::ostream::operator<<(local_188,0x40);
  local_199 = '_';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_199,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_199 = '_';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_199,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_199 = '_';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_199,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_199 = '_';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_199,1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return in_RDI;
}

Assistant:

static std::string init_name() {
      std::stringstream name_str;
      name_str << "lagfib4plus_" << std::numeric_limits<result_type>::digits << '_' << A << '_'
               << B << '_' << C << '_' << D;
      return name_str.str();
    }